

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::Reader(Reader *this,string *filename)

{
  string *in_RSI;
  Builder *in_RDI;
  Exception *e;
  Builder *this_00;
  size_t *this_01;
  undefined1 condition;
  ifstream *in_stack_ffffffffffffff90;
  string local_30 [48];
  
  this_00 = in_RDI;
  zstr::ifstream::ifstream(in_stack_ffffffffffffff90);
  this_01 = &in_RDI[5].variables._M_h._M_rehash_policy._M_next_resize;
  std::__cxx11::string::string((string *)this_01);
  std::array<RawToken,_3UL>::array((array<RawToken,_3UL> *)this_01);
  condition = (undefined1)((ulong)this_01 >> 0x38);
  std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>::vector
            ((vector<ProcessedToken,_std::allocator<ProcessedToken>_> *)0x421230);
  std::
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  ::map((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
         *)0x421246);
  Builder::Builder(this_00);
  std::__cxx11::string::string(local_30,in_RSI);
  zstr::ifstream::open((ifstream *)in_RDI,(char *)local_30,8);
  std::__cxx11::string::~string(local_30);
  zstr::ifstream::is_open((ifstream *)0x4212e6);
  lpassert((bool)condition);
  return;
}

Assistant:

Reader(std::string filename) {
#ifdef ZLIB_FOUND
    try {
      file.open(filename);
    } catch (const strict_fstream::Exception& e) {
    }
#else
    file.open(filename);
#endif
    lpassert(file.is_open());
  }